

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdDecodeSignatureFromDer
              (void *handle,char *der_signature,char **signature,int *sighash_type,
              bool *sighash_anyone_can_pay)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  CfdException *pCVar4;
  SigHashType type;
  ByteData sig;
  allocator local_91;
  undefined1 local_90 [36];
  SigHashType local_6c;
  ByteData local_60;
  ByteData local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(der_signature);
  if (bVar1) {
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x3ac;
    local_90._16_8_ = "CfdDecodeSignatureFromDer";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"der_signature is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Failed to parameter. der_signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (signature != (char **)0x0) {
    cfd::core::SigHashType::SigHashType(&local_6c);
    std::__cxx11::string::string((string *)local_90,der_signature,&local_91);
    cfd::core::ByteData::ByteData(&local_60,(string *)local_90);
    cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_48,&local_60,&local_6c);
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_90,&local_48);
    pcVar3 = cfd::capi::CreateString((string *)local_90);
    *signature = pcVar3;
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_);
    }
    if (sighash_type != (int *)0x0) {
      uVar2 = cfd::core::SigHashType::GetSigHashFlag(&local_6c);
      *sighash_type = uVar2;
    }
    if (sighash_anyone_can_pay != (bool *)0x0) {
      bVar1 = cfd::core::SigHashType::IsAnyoneCanPay(&local_6c);
      *sighash_anyone_can_pay = bVar1;
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_90._0_8_ = "cfdcapi_key.cpp";
  local_90._8_4_ = 0x3b2;
  local_90._16_8_ = "CfdDecodeSignatureFromDer";
  cfd::core::logger::log<>((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"signature is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"Failed to parameter. signature is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_90);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdDecodeSignatureFromDer(
    void* handle, const char* der_signature, char** signature,
    int* sighash_type, bool* sighash_anyone_can_pay) {
  try {
    cfd::Initialize();
    if (IsEmptyString(der_signature)) {
      warn(CFD_LOG_SOURCE, "der_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    SigHashType type;
    ByteData sig =
        CryptoUtil::ConvertSignatureFromDer(ByteData(der_signature), &type);
    *signature = CreateString(sig.GetHex());
    if (sighash_type) *sighash_type = static_cast<int>(type.GetSigHashFlag());
    if (sighash_anyone_can_pay)
      *sighash_anyone_can_pay = type.IsAnyoneCanPay();

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}